

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant.cpp
# Opt level: O3

UMatchDegree __thiscall
icu_63::Quantifier::matches
          (Quantifier *this,Replaceable *text,int32_t *offset,int32_t limit,UBool incremental)

{
  int iVar1;
  int iVar2;
  UMatchDegree UVar3;
  undefined4 extraout_var;
  int32_t pos;
  int32_t iVar4;
  uint uVar5;
  
  iVar1 = *offset;
  uVar5 = 0;
  iVar2 = iVar1;
  do {
    iVar4 = iVar2;
    if (this->maxCount <= uVar5) break;
    iVar2 = (*(this->matcher->super_UObject)._vptr_UObject[4])();
    iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar2),text,offset,limit,(int)incremental);
    if (iVar2 != 2) {
      if ((incremental != '\0') && (iVar2 == 1)) {
        return U_PARTIAL_MATCH;
      }
      iVar4 = *offset;
      break;
    }
    uVar5 = uVar5 + 1;
    iVar2 = *offset;
  } while (iVar4 != *offset);
  if (((incremental == '\0') || (UVar3 = U_PARTIAL_MATCH, iVar4 != limit)) &&
     (UVar3 = U_MATCH, uVar5 < this->minCount)) {
    *offset = iVar1;
    UVar3 = U_MISMATCH;
  }
  return UVar3;
}

Assistant:

UMatchDegree Quantifier::matches(const Replaceable& text,
                                 int32_t& offset,
                                 int32_t limit,
                                 UBool incremental) {
    int32_t start = offset;
    uint32_t count = 0;
    while (count < maxCount) {
        int32_t pos = offset;
        UMatchDegree m = matcher->toMatcher()->matches(text, offset, limit, incremental);
        if (m == U_MATCH) {
            ++count;
            if (pos == offset) {
                // If offset has not moved we have a zero-width match.
                // Don't keep matching it infinitely.
                break;
            }
        } else if (incremental && m == U_PARTIAL_MATCH) {
            return U_PARTIAL_MATCH;
        } else {
            break;
        }
    }
    if (incremental && offset == limit) {
        return U_PARTIAL_MATCH;
    }
    if (count >= minCount) {
        return U_MATCH;
    }
    offset = start;
    return U_MISMATCH;
}